

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall
asmjit::v1_14::ZoneAllocator::_releaseDynamic(ZoneAllocator *this,void *p,size_t size)

{
  long *__ptr;
  long *plVar1;
  long lVar2;
  ZoneAllocator *pZVar3;
  
  if (*(long *)this == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
               ,0x179,"isInitialized()");
  }
  __ptr = *(long **)((long)p + -8);
  pZVar3 = this + 0x58;
  do {
    plVar1 = *(long **)pZVar3;
    if (plVar1 == __ptr) break;
    pZVar3 = (ZoneAllocator *)(plVar1 + 1);
  } while (plVar1 != (long *)0x0);
  if (plVar1 != (long *)0x0) {
    lVar2 = *__ptr;
    plVar1 = (long *)__ptr[1];
    pZVar3 = (ZoneAllocator *)(lVar2 + 8);
    if (lVar2 == 0) {
      pZVar3 = this + 0x58;
    }
    *(long **)pZVar3 = plVar1;
    if (plVar1 != (long *)0x0) {
      *plVar1 = lVar2;
    }
    free(__ptr);
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
             ,0x17d,"ZoneAllocator_hasDynamicBlock(this, block)");
}

Assistant:

void ZoneAllocator::_releaseDynamic(void* p, size_t size) noexcept {
  DebugUtils::unused(size);
  ASMJIT_ASSERT(isInitialized());

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneAllocator_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  ::free(block);
}